

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_obj.c
# Opt level: O2

_Bool compare_obj_index(void *left,void *right)

{
  int iVar1;
  
  iVar1 = bcmp(left,right,0x18);
  return iVar1 == 0;
}

Assistant:

static size_t compute_unique_vertices(
    const struct obj_model* model,
    struct hash_table* index_table,
    bool* has_normals, bool* has_tex_coords)
{
    // This maps unique triplets (v, t, n) to a unique vertex,
    // in order to match the way mesh indices work.
    for (size_t i = 0, n = model->index_count; i < n; ++i) {
        const struct obj_index* index = &model->indices[i];
        *has_normals |= index->n != 0;
        *has_tex_coords |= index->t != 0;
        size_t index_count = index_table->size;
        insert_in_hash_table(
            index_table,
            index, sizeof(struct obj_index),
            &index_count, sizeof(size_t),
            hash_obj_index(index),
            compare_obj_index);
    }
    return index_table->size;
}